

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O0

char * cpp_client::Base_game::get_alias_abi_cxx11_(char *name,char *server,int port)

{
  bool bVar1;
  Ch *str;
  ostream *poVar2;
  Type doc_00;
  undefined4 in_ECX;
  size_t __n;
  void *__buf;
  int in_R8D;
  attr_wrapper local_178 [32];
  attr_wrapper local_158 [32];
  undefined1 local_138 [8];
  Document doc;
  string resp;
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [8];
  string alias;
  undefined1 local_38 [8];
  Connection conn;
  int port_local;
  char *server_local;
  char *name_local;
  
  conn._12_4_ = in_ECX;
  Connection::Connection((Connection *)local_38,false);
  __n = 0;
  Connection::connect((Connection *)local_38,port,(sockaddr *)(ulong)(uint)conn._12_4_,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,server,&local_a9);
  std::operator+((char *)local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "{\"event\": \"alias\", \"data\": \"");
  std::operator+(local_68,(char *)local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  Connection::send((Connection *)local_38,(int)local_68,__buf,__n,in_R8D);
  Connection::recieve_abi_cxx11_((Connection *)&doc.parseResult_.offset_);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)local_138,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  str = (Ch *)std::__cxx11::string::c_str();
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *)local_138,str);
  attr_wrapper::get_attribute<std::__cxx11::string>(local_158,(Value *)local_138,"event");
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_158,"fatal");
  std::__cxx11::string::~string((string *)local_158);
  if (!bVar1) {
    attr_wrapper::get_attribute<std::__cxx11::string>
              ((attr_wrapper *)name,(Value *)local_138,"data");
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *)local_138);
    std::__cxx11::string::~string((string *)&doc.parseResult_.offset_);
    std::__cxx11::string::~string((string *)local_68);
    Connection::~Connection((Connection *)local_38);
    return name;
  }
  poVar2 = ::operator<<((ostream *)&std::cout,text_red);
  poVar2 = std::operator<<(poVar2,"Fatal: ");
  doc_00 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)local_138,"data");
  attr_wrapper::get_attribute<std::__cxx11::string>(local_178,doc_00,"message");
  poVar2 = std::operator<<(poVar2,(string *)local_178);
  poVar2 = std::operator<<(poVar2,'\n');
  ::operator<<(poVar2,normal);
  std::__cxx11::string::~string((string *)local_178);
  exit(1);
}

Assistant:

std::string Base_game::get_alias(const char* name, const char* server, int port)
{
   Connection conn;
   conn.connect(server, port, false);
   std::string alias = R"({"event": "alias", "data": ")" + std::string(name) + "\"}";
   conn.send(alias);
   const auto resp = conn.recieve();
   rapidjson::Document doc;
   doc.Parse(resp.c_str());
   if(attr_wrapper::get_attribute<std::string>(doc, "event") == "fatal")
   {
      std::cout << sgr::text_red << "Fatal: "
                << attr_wrapper::get_attribute<std::string>(doc["data"], "message") << '\n'
                << sgr::reset;
      exit(1);
   }
   return attr_wrapper::get_attribute<std::string>(doc, "data");
}